

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O3

bool __thiscall
rlottie::internal::renderer::GradientFill::updateContent
          (GradientFill *this,int frameNo,VMatrix *matrix,float alpha)

{
  VGradient *pVVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  Gradient *this_00;
  float fVar8;
  float fVar9;
  VBrush local_28;
  
  this_00 = &this->mData->super_Gradient;
  if ((this_00->mOpacity).isValue_ == true) {
    fVar8 = (this_00->mOpacity).impl_.value_;
  }
  else {
    fVar8 = model::KeyFrames<float,_void>::value((this_00->mOpacity).impl_,frameNo);
    this_00 = &this->mData->super_Gradient;
  }
  fVar9 = (fVar8 / 100.0) * alpha;
  model::Gradient::update(this_00,&this->mGradient,frameNo);
  pVVar1 = (this->mGradient)._M_t.super___uniq_ptr_impl<VGradient,_std::default_delete<VGradient>_>.
           _M_t.super__Tuple_impl<0UL,_VGradient_*,_std::default_delete<VGradient>_>.
           super__Head_base<0UL,_VGradient_*,_false>._M_head_impl;
  pVVar1->mAlpha = fVar9;
  fVar8 = matrix->m12;
  fVar2 = matrix->m13;
  fVar3 = matrix->m21;
  fVar4 = matrix->m22;
  fVar5 = matrix->m23;
  fVar6 = matrix->mtx;
  fVar7 = matrix->mty;
  (pVVar1->mMatrix).m11 = matrix->m11;
  (pVVar1->mMatrix).m12 = fVar8;
  (pVVar1->mMatrix).m13 = fVar2;
  (pVVar1->mMatrix).m21 = fVar3;
  (pVVar1->mMatrix).m22 = fVar4;
  (pVVar1->mMatrix).m23 = fVar5;
  (pVVar1->mMatrix).mtx = fVar6;
  (pVVar1->mMatrix).mty = fVar7;
  *(undefined8 *)((long)&(pVVar1->mMatrix).mty + 2) = *(undefined8 *)((long)&matrix->mty + 2);
  VBrush::VBrush(&local_28,
                 (this->mGradient)._M_t.
                 super___uniq_ptr_impl<VGradient,_std::default_delete<VGradient>_>._M_t.
                 super__Tuple_impl<0UL,_VGradient_*,_std::default_delete<VGradient>_>.
                 super__Head_base<0UL,_VGradient_*,_false>._M_head_impl);
  (this->super_Paint).mDrawable.super_VDrawable.mBrush.mType = local_28.mType;
  *(undefined4 *)&(this->super_Paint).mDrawable.super_VDrawable.mBrush.field_0x4 = local_28._4_4_;
  (this->super_Paint).mDrawable.super_VDrawable.mBrush.field_1 = local_28.field_1;
  (this->super_Paint).mDrawable.super_VDrawable.mFillRule = (this->mData->super_Gradient).field_0x8d
  ;
  return 1e-06 < ABS(fVar9);
}

Assistant:

bool renderer::GradientFill::updateContent(int frameNo, const VMatrix &matrix,
                                           float alpha)
{
    float combinedAlpha = alpha * mData->opacity(frameNo);

    mData->update(mGradient, frameNo);
    mGradient->setAlpha(combinedAlpha);
    mGradient->mMatrix = matrix;
    mDrawable.setBrush(VBrush(mGradient.get()));
    mDrawable.setFillRule(mData->fillRule());

    return !vIsZero(combinedAlpha);
}